

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O2

void __thiscall
OpenMD::BOPofR::BOPofR
          (BOPofR *this,SimInfo *info,string *filename,string *sele,double rCut,uint nbins,
          RealType len)

{
  SelectionEvaluator *this_00;
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  RealType RVar5;
  int ii;
  uint uVar6;
  ostream *poVar7;
  RealType *thrcof;
  long lVar8;
  mapped_type *pmVar9;
  mapped_type *this_01;
  long lVar10;
  ulong uVar11;
  int mmm;
  RealType *__x;
  double l1;
  double dVar12;
  uint local_254;
  RealType m2M;
  RealType m2m;
  string paramString;
  pair<int,_int> lm;
  int error;
  stringstream params;
  ostream local_1a8 [376];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__BOPofR_002ecd80;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  SelectionManager::SelectionManager(&this->seleMan_,info);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  p_Var1 = &(this->m2Min)._M_t._M_impl.super__Rb_tree_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m2Max)._M_t._M_impl.super__Rb_tree_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->w3j)._M_t._M_impl.super__Rb_tree_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->RCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->RCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->WofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->WofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->WofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->QofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->QofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->QofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getPrefix(&paramString,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                 &paramString,".bo");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&params);
  std::__cxx11::string::~string((string *)&paramString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&params,"Bond Order Parameter(r)",(allocator<char> *)&paramString);
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  std::__cxx11::string::~string((string *)&params);
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&params,this_00);
    SelectionManager::setSelectionSet(&this->seleMan_,(SelectionSet *)&params);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&params);
  }
  this->rCut_ = rCut;
  this->len_ = len;
  std::__cxx11::stringstream::stringstream((stringstream *)&params);
  std::operator<<(local_1a8," rcut = ");
  poVar7 = std::ostream::_M_insert<double>(this->rCut_);
  std::operator<<(poVar7,", len = ");
  poVar7 = std::ostream::_M_insert<double>(this->len_);
  poVar7 = std::operator<<(poVar7,", nbins = ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  uVar11 = (ulong)(this->super_StaticAnalyser).nBins_;
  this->deltaR_ = this->len_ / (double)uVar11;
  std::vector<int,_std::allocator<int>_>::resize(&this->RCount_,uVar11);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->WofR_,(ulong)(this->super_StaticAnalyser).nBins_);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->QofR_,(ulong)(this->super_StaticAnalyser).nBins_);
  piVar2 = (this->RCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->WofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->QofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar11 = 0; uVar11 < (this->super_StaticAnalyser).nBins_; uVar11 = uVar11 + 1) {
    piVar2[uVar11] = 0;
    piVar3[uVar11] = 0;
    piVar4[uVar11] = 0;
  }
  thrcof = (RealType *)operator_new__(0x68);
  local_254 = 1;
  lVar10 = 1;
  for (uVar11 = 0; uVar11 != 7; uVar11 = uVar11 + 1) {
    l1 = (double)(int)uVar11;
    for (uVar6 = -(int)uVar11; uVar6 != local_254; uVar6 = uVar6 + 1) {
      lm = (pair<int,_int>)((ulong)uVar6 << 0x20 | uVar11);
      for (lVar8 = 0; lVar10 != lVar8; lVar8 = lVar8 + 1) {
        thrcof[lVar8] = 0.0;
      }
      MATPACK::Wigner3jm(l1,l1,l1,(double)(int)uVar6,&m2m,&m2M,thrcof,0xd,&error);
      RVar5 = m2m;
      pmVar9 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->m2Min,&lm);
      dVar12 = floor(RVar5);
      RVar5 = m2M;
      *pmVar9 = (int)dVar12;
      pmVar9 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->m2Max,&lm);
      dVar12 = floor(RVar5);
      *pmVar9 = (int)dVar12;
      __x = thrcof;
      for (lVar8 = 0; lVar8 <= (int)(m2M - m2m); lVar8 = lVar8 + 1) {
        this_01 = std::
                  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](&this->w3j,&lm);
        std::vector<double,_std::allocator<double>_>::push_back(this_01,__x);
        __x = __x + 1;
      }
    }
    lVar10 = lVar10 + 2;
    local_254 = local_254 + 1;
  }
  operator_delete__(thrcof);
  std::__cxx11::string::~string((string *)&paramString);
  std::__cxx11::stringstream::~stringstream((stringstream *)&params);
  return;
}

Assistant:

BOPofR::BOPofR(SimInfo* info, const std::string& filename,
                 const std::string& sele, double rCut, unsigned int nbins,
                 RealType len) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setOutputName(getPrefix(filename) + ".bo");
    setAnalysisType("Bond Order Parameter(r)");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius and order of the Legendre Polynomial:

    rCut_ = rCut;
    len_  = len;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", len = " << len_
           << ", nbins = " << nBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    deltaR_ = len_ / nBins_;
    RCount_.resize(nBins_);
    WofR_.resize(nBins_);
    QofR_.resize(nBins_);

    for (unsigned int i = 0; i < nBins_; i++) {
      RCount_[i] = 0;
      WofR_[i]   = 0;
      QofR_[i]   = 0;
    }

    // Make arrays for Wigner3jm
    RealType* THRCOF = new RealType[2 * lMax_ + 1];
    // Variables for Wigner routine
    RealType lPass, m1Pass, m2m, m2M;
    int error, mSize;
    mSize = 2 * lMax_ + 1;

    for (int l = 0; l <= lMax_; l++) {
      lPass = (RealType)l;
      for (int m1 = -l; m1 <= l; m1++) {
        m1Pass = (RealType)m1;

        std::pair<int, int> lm = std::make_pair(l, m1);

        // Zero work array
        for (int ii = 0; ii < 2 * l + 1; ii++) {
          THRCOF[ii] = 0.0;
        }

        // Get Wigner coefficients
        Wigner3jm(lPass, lPass, lPass, m1Pass, m2m, m2M, THRCOF, mSize, error);

        m2Min[lm] = (int)floor(m2m);
        m2Max[lm] = (int)floor(m2M);

        for (int mmm = 0; mmm <= (int)(m2M - m2m); mmm++) {
          w3j[lm].push_back(THRCOF[mmm]);
        }
      }
    }

    delete[] THRCOF;
    THRCOF = NULL;
  }